

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_32x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar15 [16];
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  __m128i y_select_1;
  int y_mask_1;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i left;
  __m128i round;
  __m128i scaled_top_right4;
  __m128i scaled_top_right3;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i top_right;
  __m128i pred2_7;
  __m128i pred1_7;
  __m128i pred_sum2_7;
  __m128i pred_sum1_7;
  __m128i weighted_px2_7;
  __m128i weighted_px1_7;
  __m128i pred2_6;
  __m128i pred1_6;
  __m128i pred_sum2_6;
  __m128i pred_sum1_6;
  __m128i weighted_px2_6;
  __m128i weighted_px1_6;
  __m128i pred2_5;
  __m128i pred1_5;
  __m128i pred_sum2_5;
  __m128i pred_sum1_5;
  __m128i weighted_px2_5;
  __m128i weighted_px1_5;
  __m128i pred2_4;
  __m128i pred1_4;
  __m128i pred_sum2_4;
  __m128i pred_sum1_4;
  __m128i weighted_px2_4;
  __m128i weighted_px1_4;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_18fc;
  int local_18cc;
  int local_189c;
  int local_186c;
  undefined8 *local_1728;
  byte local_1668;
  undefined1 uStack_1667;
  undefined1 uStack_1666;
  undefined1 uStack_1665;
  byte bStack_1664;
  undefined1 uStack_1663;
  undefined1 uStack_1662;
  undefined1 uStack_1661;
  byte local_1628;
  undefined1 uStack_1627;
  undefined1 uStack_1626;
  undefined1 uStack_1625;
  byte bStack_1624;
  undefined1 uStack_1623;
  undefined1 uStack_1622;
  undefined1 uStack_1621;
  byte local_15e8;
  undefined1 uStack_15e7;
  undefined1 uStack_15e6;
  undefined1 uStack_15e5;
  byte bStack_15e4;
  undefined1 uStack_15e3;
  undefined1 uStack_15e2;
  undefined1 uStack_15e1;
  byte local_15a8;
  undefined1 uStack_15a7;
  undefined1 uStack_15a6;
  undefined1 uStack_15a5;
  byte bStack_15a4;
  undefined1 uStack_15a3;
  undefined1 uStack_15a2;
  undefined1 uStack_15a1;
  ushort uStack_1412;
  ushort uStack_140a;
  ushort uStack_13f2;
  ushort uStack_13ea;
  ushort uStack_13d2;
  ushort uStack_13ca;
  ushort uStack_13b6;
  ushort uStack_13b4;
  ushort uStack_13b2;
  ushort uStack_13ae;
  ushort uStack_13ac;
  ushort uStack_13aa;
  short local_f78;
  short sStack_f76;
  short sStack_f74;
  short sStack_f72;
  short sStack_f70;
  short sStack_f6e;
  short sStack_f6c;
  short sStack_f6a;
  short local_bf8;
  short sStack_bf6;
  short sStack_bf4;
  short sStack_bf2;
  short sStack_bf0;
  short sStack_bee;
  short sStack_bec;
  short sStack_bea;
  short local_878;
  short sStack_876;
  short sStack_874;
  short sStack_872;
  short sStack_870;
  short sStack_86e;
  short sStack_86c;
  short sStack_86a;
  short local_4f8;
  short sStack_4f6;
  short sStack_4f4;
  short sStack_4f2;
  short sStack_4f0;
  short sStack_4ee;
  short sStack_4ec;
  short sStack_4ea;
  __m128i left_y_3;
  __m128i y_select_3;
  int y_mask_3;
  __m128i left_y_2;
  __m128i y_select_2;
  int y_mask_2;
  __m128i left_y_1;
  
  bVar2 = *(byte *)(in_RDX + 0x1f);
  uVar10 = (ushort)bVar2;
  uStack_13b6 = (ushort)bVar2;
  uStack_13b4 = (ushort)bVar2;
  uStack_13b2 = (ushort)bVar2;
  uStack_13ae = (ushort)bVar2;
  uStack_13ac = (ushort)bVar2;
  uStack_13aa = (ushort)bVar2;
  sVar47 = uStack_13b6 * 0x10;
  sVar51 = uStack_13b4 * 0x1f;
  sVar55 = uStack_13b2 * 0x2e;
  sVar59 = uVar10 * 0x3c;
  sVar63 = uStack_13ae * 0x4a;
  sVar67 = uStack_13ac * 0x57;
  sVar71 = uStack_13aa * 99;
  uStack_13d2 = (ushort)bVar2;
  uStack_13ca = (ushort)bVar2;
  sVar44 = uVar10 * 0x6f;
  sVar48 = uStack_13b6 * 0x7b;
  sVar52 = uStack_13b4 * 0x86;
  sVar56 = uStack_13d2 * 0x91;
  sVar60 = uVar10 * 0x9b;
  sVar64 = uStack_13ae * 0xa4;
  sVar68 = uStack_13ac * 0xad;
  sVar72 = uStack_13ca * 0xb6;
  uStack_13f2 = (ushort)bVar2;
  uStack_13ea = (ushort)bVar2;
  sVar45 = uVar10 * 0xbe;
  sVar49 = uStack_13b6 * 0xc5;
  sVar53 = uStack_13b4 * 0xcc;
  sVar57 = uStack_13f2 * 0xd3;
  sVar61 = uVar10 * 0xd9;
  sVar65 = uStack_13ae * 0xde;
  sVar69 = uStack_13ac * 0xe3;
  sVar73 = uStack_13ea * 0xe7;
  uStack_1412 = (ushort)bVar2;
  uStack_140a = (ushort)bVar2;
  sVar46 = uVar10 * 0xeb;
  sVar50 = uStack_13b6 * 0xef;
  sVar54 = uStack_13b4 * 0xf2;
  sVar58 = uStack_1412 * 0xf4;
  sVar62 = uVar10 * 0xf6;
  sVar66 = uStack_13ae * 0xf7;
  sVar70 = uStack_13ac * 0xf8;
  sVar74 = uStack_140a * 0xf8;
  uVar1 = *in_RCX;
  local_15a8 = (byte)uVar1;
  uStack_15a7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_15a6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_15a5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_15a4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_15a3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_15a2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_15a1 = (undefined1)((ulong)uVar1 >> 0x38);
  local_1728 = in_RDI;
  for (local_186c = 0x1000100; local_186c < 0xf0e0f0f; local_186c = local_186c + 0x2020202) {
    auVar8._4_4_ = local_186c;
    auVar8._0_4_ = local_186c;
    auVar8._12_4_ = local_186c;
    auVar8._8_4_ = local_186c;
    auVar9[1] = 0;
    auVar9[0] = local_15a8;
    auVar9[2] = uStack_15a7;
    auVar9[3] = 0;
    auVar9[4] = uStack_15a6;
    auVar9[5] = 0;
    auVar9[6] = uStack_15a5;
    auVar9[7] = 0;
    auVar9[9] = 0;
    auVar9[8] = bStack_15a4;
    auVar9[10] = uStack_15a3;
    auVar9[0xb] = 0;
    auVar9[0xc] = uStack_15a2;
    auVar9[0xd] = 0;
    auVar9[0xe] = uStack_15a1;
    auVar9[0xf] = 0;
    auVar15 = pshufb(auVar9,auVar8);
    local_4f8 = auVar15._0_2_;
    sStack_4f6 = auVar15._2_2_;
    sStack_4f4 = auVar15._4_2_;
    sStack_4f2 = auVar15._6_2_;
    sStack_4f0 = auVar15._8_2_;
    sStack_4ee = auVar15._10_2_;
    sStack_4ec = auVar15._12_2_;
    sStack_4ea = auVar15._14_2_;
    uVar11 = uVar10 + local_4f8 * 0xff + 0x80;
    uVar16 = sVar47 + sStack_4f6 * 0xf0 + 0x80;
    uVar20 = sVar51 + sStack_4f4 * 0xe1 + 0x80;
    uVar24 = sVar55 + sStack_4f2 * 0xd2 + 0x80;
    uVar28 = sVar59 + sStack_4f0 * 0xc4 + 0x80;
    uVar32 = sVar63 + sStack_4ee * 0xb6 + 0x80;
    uVar36 = sVar67 + sStack_4ec * 0xa9 + 0x80;
    uVar40 = sVar71 + sStack_4ea * 0x9d + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar44 + local_4f8 * 0x91 + 0x80;
    uVar18 = sVar48 + sStack_4f6 * 0x85 + 0x80;
    uVar22 = sVar52 + sStack_4f4 * 0x7a + 0x80;
    uVar26 = sVar56 + sStack_4f2 * 0x6f + 0x80;
    uVar30 = sVar60 + sStack_4f0 * 0x65 + 0x80;
    uVar34 = sVar64 + sStack_4ee * 0x5c + 0x80;
    uVar38 = sVar68 + sStack_4ec * 0x53 + 0x80;
    uVar42 = sVar72 + sStack_4ea * 0x4a + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    *local_1728 = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                           CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                    (0xff < uVar37),
                                    CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8)
                                             - (0xff < uVar33),
                                             CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                      (char)(uVar28 >> 8) - (0xff < uVar29),
                                                      CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                               (char)(uVar24 >> 8) - (0xff < uVar25)
                                                               ,CONCAT12((uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21),
                                                                         CONCAT11((uVar17 != 0) *
                                                                                  (uVar17 < 0x100) *
                                                                                  (char)(uVar16 >> 8
                                                                                        ) - (0xff < 
                                                  uVar17),(uVar12 != 0) * (uVar12 < 0x100) *
                                                          (char)(uVar11 >> 8) - (0xff < uVar12))))))
                                   ));
    local_1728[1] =
         CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43),
                  CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                           CONCAT15((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                    (0xff < uVar35),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar14 != 0) *
                                                                         (uVar14 < 0x100) *
                                                                         (char)(uVar13 >> 8) -
                                                                         (0xff < uVar14))))))));
    uVar11 = sVar45 + local_4f8 * 0x42 + 0x80;
    uVar16 = sVar49 + sStack_4f6 * 0x3b + 0x80;
    uVar20 = sVar53 + sStack_4f4 * 0x34 + 0x80;
    uVar24 = sVar57 + sStack_4f2 * 0x2d + 0x80;
    uVar28 = sVar61 + sStack_4f0 * 0x27 + 0x80;
    uVar32 = sVar65 + sStack_4ee * 0x22 + 0x80;
    uVar36 = sVar69 + sStack_4ec * 0x1d + 0x80;
    uVar40 = sVar73 + sStack_4ea * 0x19 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar46 + local_4f8 * 0x15 + 0x80;
    uVar18 = sVar50 + sStack_4f6 * 0x11 + 0x80;
    uVar22 = sVar54 + sStack_4f4 * 0xe + 0x80;
    uVar26 = sVar58 + sStack_4f2 * 0xc + 0x80;
    uVar30 = sVar62 + sStack_4f0 * 10 + 0x80;
    uVar34 = sVar66 + sStack_4ee * 9 + 0x80;
    uVar38 = sVar70 + sStack_4ec * 8 + 0x80;
    uVar42 = sVar74 + sStack_4ea * 8 + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    local_1728[2] =
         CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                  CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                           CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                    (0xff < uVar33),
                                    CONCAT14((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8)
                                             - (0xff < uVar29),
                                             CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                      (char)(uVar24 >> 8) - (0xff < uVar25),
                                                      CONCAT12((uVar21 != 0) * (uVar21 < 0x100) *
                                                               (char)(uVar20 >> 8) - (0xff < uVar21)
                                                               ,CONCAT11((uVar17 != 0) *
                                                                         (uVar17 < 0x100) *
                                                                         (char)(uVar16 >> 8) -
                                                                         (0xff < uVar17),
                                                                         (uVar12 != 0) *
                                                                         (uVar12 < 0x100) *
                                                                         (char)(uVar11 >> 8) -
                                                                         (0xff < uVar12))))))));
    local_1728[3] =
         CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43),
                  CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                           CONCAT15((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                    (0xff < uVar35),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar14 != 0) *
                                                                         (uVar14 < 0x100) *
                                                                         (char)(uVar13 >> 8) -
                                                                         (0xff < uVar14))))))));
    local_1728 = (undefined8 *)(in_RSI + (long)local_1728);
  }
  uVar1 = in_RCX[1];
  local_15e8 = (byte)uVar1;
  uStack_15e7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_15e6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_15e5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_15e4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_15e3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_15e2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_15e1 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_189c = 0x1000100; local_189c < 0xf0e0f0f; local_189c = local_189c + 0x2020202) {
    auVar6._4_4_ = local_189c;
    auVar6._0_4_ = local_189c;
    auVar6._12_4_ = local_189c;
    auVar6._8_4_ = local_189c;
    auVar7[1] = 0;
    auVar7[0] = local_15e8;
    auVar7[2] = uStack_15e7;
    auVar7[3] = 0;
    auVar7[4] = uStack_15e6;
    auVar7[5] = 0;
    auVar7[6] = uStack_15e5;
    auVar7[7] = 0;
    auVar7[9] = 0;
    auVar7[8] = bStack_15e4;
    auVar7[10] = uStack_15e3;
    auVar7[0xb] = 0;
    auVar7[0xc] = uStack_15e2;
    auVar7[0xd] = 0;
    auVar7[0xe] = uStack_15e1;
    auVar7[0xf] = 0;
    auVar15 = pshufb(auVar7,auVar6);
    local_878 = auVar15._0_2_;
    sStack_876 = auVar15._2_2_;
    sStack_874 = auVar15._4_2_;
    sStack_872 = auVar15._6_2_;
    sStack_870 = auVar15._8_2_;
    sStack_86e = auVar15._10_2_;
    sStack_86c = auVar15._12_2_;
    sStack_86a = auVar15._14_2_;
    uVar11 = uVar10 + local_878 * 0xff + 0x80;
    uVar16 = sVar47 + sStack_876 * 0xf0 + 0x80;
    uVar20 = sVar51 + sStack_874 * 0xe1 + 0x80;
    uVar24 = sVar55 + sStack_872 * 0xd2 + 0x80;
    uVar28 = sVar59 + sStack_870 * 0xc4 + 0x80;
    uVar32 = sVar63 + sStack_86e * 0xb6 + 0x80;
    uVar36 = sVar67 + sStack_86c * 0xa9 + 0x80;
    uVar40 = sVar71 + sStack_86a * 0x9d + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar44 + local_878 * 0x91 + 0x80;
    uVar18 = sVar48 + sStack_876 * 0x85 + 0x80;
    uVar22 = sVar52 + sStack_874 * 0x7a + 0x80;
    uVar26 = sVar56 + sStack_872 * 0x6f + 0x80;
    uVar30 = sVar60 + sStack_870 * 0x65 + 0x80;
    uVar34 = sVar64 + sStack_86e * 0x5c + 0x80;
    uVar38 = sVar68 + sStack_86c * 0x53 + 0x80;
    uVar42 = sVar72 + sStack_86a * 0x4a + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    *local_1728 = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                           CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                    (0xff < uVar37),
                                    CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8)
                                             - (0xff < uVar33),
                                             CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                      (char)(uVar28 >> 8) - (0xff < uVar29),
                                                      CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                               (char)(uVar24 >> 8) - (0xff < uVar25)
                                                               ,CONCAT12((uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21),
                                                                         CONCAT11((uVar17 != 0) *
                                                                                  (uVar17 < 0x100) *
                                                                                  (char)(uVar16 >> 8
                                                                                        ) - (0xff < 
                                                  uVar17),(uVar12 != 0) * (uVar12 < 0x100) *
                                                          (char)(uVar11 >> 8) - (0xff < uVar12))))))
                                   ));
    local_1728[1] =
         CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43),
                  CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                           CONCAT15((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                    (0xff < uVar35),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar14 != 0) *
                                                                         (uVar14 < 0x100) *
                                                                         (char)(uVar13 >> 8) -
                                                                         (0xff < uVar14))))))));
    uVar11 = sVar45 + local_878 * 0x42 + 0x80;
    uVar16 = sVar49 + sStack_876 * 0x3b + 0x80;
    uVar20 = sVar53 + sStack_874 * 0x34 + 0x80;
    uVar24 = sVar57 + sStack_872 * 0x2d + 0x80;
    uVar28 = sVar61 + sStack_870 * 0x27 + 0x80;
    uVar32 = sVar65 + sStack_86e * 0x22 + 0x80;
    uVar36 = sVar69 + sStack_86c * 0x1d + 0x80;
    uVar40 = sVar73 + sStack_86a * 0x19 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar46 + local_878 * 0x15 + 0x80;
    uVar18 = sVar50 + sStack_876 * 0x11 + 0x80;
    uVar22 = sVar54 + sStack_874 * 0xe + 0x80;
    uVar26 = sVar58 + sStack_872 * 0xc + 0x80;
    uVar30 = sVar62 + sStack_870 * 10 + 0x80;
    uVar34 = sVar66 + sStack_86e * 9 + 0x80;
    uVar38 = sVar70 + sStack_86c * 8 + 0x80;
    uVar42 = sVar74 + sStack_86a * 8 + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    local_1728[2] =
         CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                  CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                           CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                    (0xff < uVar33),
                                    CONCAT14((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8)
                                             - (0xff < uVar29),
                                             CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                      (char)(uVar24 >> 8) - (0xff < uVar25),
                                                      CONCAT12((uVar21 != 0) * (uVar21 < 0x100) *
                                                               (char)(uVar20 >> 8) - (0xff < uVar21)
                                                               ,CONCAT11((uVar17 != 0) *
                                                                         (uVar17 < 0x100) *
                                                                         (char)(uVar16 >> 8) -
                                                                         (0xff < uVar17),
                                                                         (uVar12 != 0) *
                                                                         (uVar12 < 0x100) *
                                                                         (char)(uVar11 >> 8) -
                                                                         (0xff < uVar12))))))));
    local_1728[3] =
         CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43),
                  CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                           CONCAT15((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                    (0xff < uVar35),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar14 != 0) *
                                                                         (uVar14 < 0x100) *
                                                                         (char)(uVar13 >> 8) -
                                                                         (0xff < uVar14))))))));
    local_1728 = (undefined8 *)(in_RSI + (long)local_1728);
  }
  uVar1 = in_RCX[2];
  local_1628 = (byte)uVar1;
  uStack_1627 = (undefined1)((ulong)uVar1 >> 8);
  uStack_1626 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_1625 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_1624 = (byte)((ulong)uVar1 >> 0x20);
  uStack_1623 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_1622 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_1621 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_18cc = 0x1000100; local_18cc < 0xf0e0f0f; local_18cc = local_18cc + 0x2020202) {
    auVar4._4_4_ = local_18cc;
    auVar4._0_4_ = local_18cc;
    auVar4._12_4_ = local_18cc;
    auVar4._8_4_ = local_18cc;
    auVar5[1] = 0;
    auVar5[0] = local_1628;
    auVar5[2] = uStack_1627;
    auVar5[3] = 0;
    auVar5[4] = uStack_1626;
    auVar5[5] = 0;
    auVar5[6] = uStack_1625;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_1624;
    auVar5[10] = uStack_1623;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_1622;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_1621;
    auVar5[0xf] = 0;
    auVar15 = pshufb(auVar5,auVar4);
    local_bf8 = auVar15._0_2_;
    sStack_bf6 = auVar15._2_2_;
    sStack_bf4 = auVar15._4_2_;
    sStack_bf2 = auVar15._6_2_;
    sStack_bf0 = auVar15._8_2_;
    sStack_bee = auVar15._10_2_;
    sStack_bec = auVar15._12_2_;
    sStack_bea = auVar15._14_2_;
    uVar11 = uVar10 + local_bf8 * 0xff + 0x80;
    uVar16 = sVar47 + sStack_bf6 * 0xf0 + 0x80;
    uVar20 = sVar51 + sStack_bf4 * 0xe1 + 0x80;
    uVar24 = sVar55 + sStack_bf2 * 0xd2 + 0x80;
    uVar28 = sVar59 + sStack_bf0 * 0xc4 + 0x80;
    uVar32 = sVar63 + sStack_bee * 0xb6 + 0x80;
    uVar36 = sVar67 + sStack_bec * 0xa9 + 0x80;
    uVar40 = sVar71 + sStack_bea * 0x9d + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar44 + local_bf8 * 0x91 + 0x80;
    uVar18 = sVar48 + sStack_bf6 * 0x85 + 0x80;
    uVar22 = sVar52 + sStack_bf4 * 0x7a + 0x80;
    uVar26 = sVar56 + sStack_bf2 * 0x6f + 0x80;
    uVar30 = sVar60 + sStack_bf0 * 0x65 + 0x80;
    uVar34 = sVar64 + sStack_bee * 0x5c + 0x80;
    uVar38 = sVar68 + sStack_bec * 0x53 + 0x80;
    uVar42 = sVar72 + sStack_bea * 0x4a + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    *local_1728 = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                           CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                    (0xff < uVar37),
                                    CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8)
                                             - (0xff < uVar33),
                                             CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                      (char)(uVar28 >> 8) - (0xff < uVar29),
                                                      CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                               (char)(uVar24 >> 8) - (0xff < uVar25)
                                                               ,CONCAT12((uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21),
                                                                         CONCAT11((uVar17 != 0) *
                                                                                  (uVar17 < 0x100) *
                                                                                  (char)(uVar16 >> 8
                                                                                        ) - (0xff < 
                                                  uVar17),(uVar12 != 0) * (uVar12 < 0x100) *
                                                          (char)(uVar11 >> 8) - (0xff < uVar12))))))
                                   ));
    local_1728[1] =
         CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43),
                  CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                           CONCAT15((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                    (0xff < uVar35),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar14 != 0) *
                                                                         (uVar14 < 0x100) *
                                                                         (char)(uVar13 >> 8) -
                                                                         (0xff < uVar14))))))));
    uVar11 = sVar45 + local_bf8 * 0x42 + 0x80;
    uVar16 = sVar49 + sStack_bf6 * 0x3b + 0x80;
    uVar20 = sVar53 + sStack_bf4 * 0x34 + 0x80;
    uVar24 = sVar57 + sStack_bf2 * 0x2d + 0x80;
    uVar28 = sVar61 + sStack_bf0 * 0x27 + 0x80;
    uVar32 = sVar65 + sStack_bee * 0x22 + 0x80;
    uVar36 = sVar69 + sStack_bec * 0x1d + 0x80;
    uVar40 = sVar73 + sStack_bea * 0x19 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar46 + local_bf8 * 0x15 + 0x80;
    uVar18 = sVar50 + sStack_bf6 * 0x11 + 0x80;
    uVar22 = sVar54 + sStack_bf4 * 0xe + 0x80;
    uVar26 = sVar58 + sStack_bf2 * 0xc + 0x80;
    uVar30 = sVar62 + sStack_bf0 * 10 + 0x80;
    uVar34 = sVar66 + sStack_bee * 9 + 0x80;
    uVar38 = sVar70 + sStack_bec * 8 + 0x80;
    uVar42 = sVar74 + sStack_bea * 8 + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    local_1728[2] =
         CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                  CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                           CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                    (0xff < uVar33),
                                    CONCAT14((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8)
                                             - (0xff < uVar29),
                                             CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                      (char)(uVar24 >> 8) - (0xff < uVar25),
                                                      CONCAT12((uVar21 != 0) * (uVar21 < 0x100) *
                                                               (char)(uVar20 >> 8) - (0xff < uVar21)
                                                               ,CONCAT11((uVar17 != 0) *
                                                                         (uVar17 < 0x100) *
                                                                         (char)(uVar16 >> 8) -
                                                                         (0xff < uVar17),
                                                                         (uVar12 != 0) *
                                                                         (uVar12 < 0x100) *
                                                                         (char)(uVar11 >> 8) -
                                                                         (0xff < uVar12))))))));
    local_1728[3] =
         CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43),
                  CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                           CONCAT15((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                    (0xff < uVar35),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar14 != 0) *
                                                                         (uVar14 < 0x100) *
                                                                         (char)(uVar13 >> 8) -
                                                                         (0xff < uVar14))))))));
    local_1728 = (undefined8 *)(in_RSI + (long)local_1728);
  }
  uVar1 = in_RCX[3];
  local_1668 = (byte)uVar1;
  uStack_1667 = (undefined1)((ulong)uVar1 >> 8);
  uStack_1666 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_1665 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_1664 = (byte)((ulong)uVar1 >> 0x20);
  uStack_1663 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_1662 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_1661 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_18fc = 0x1000100; local_18fc < 0xf0e0f0f; local_18fc = local_18fc + 0x2020202) {
    auVar15._4_4_ = local_18fc;
    auVar15._0_4_ = local_18fc;
    auVar15._12_4_ = local_18fc;
    auVar15._8_4_ = local_18fc;
    auVar3[1] = 0;
    auVar3[0] = local_1668;
    auVar3[2] = uStack_1667;
    auVar3[3] = 0;
    auVar3[4] = uStack_1666;
    auVar3[5] = 0;
    auVar3[6] = uStack_1665;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_1664;
    auVar3[10] = uStack_1663;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_1662;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_1661;
    auVar3[0xf] = 0;
    auVar15 = pshufb(auVar3,auVar15);
    local_f78 = auVar15._0_2_;
    sStack_f76 = auVar15._2_2_;
    sStack_f74 = auVar15._4_2_;
    sStack_f72 = auVar15._6_2_;
    sStack_f70 = auVar15._8_2_;
    sStack_f6e = auVar15._10_2_;
    sStack_f6c = auVar15._12_2_;
    sStack_f6a = auVar15._14_2_;
    uVar11 = uVar10 + local_f78 * 0xff + 0x80;
    uVar16 = sVar47 + sStack_f76 * 0xf0 + 0x80;
    uVar20 = sVar51 + sStack_f74 * 0xe1 + 0x80;
    uVar24 = sVar55 + sStack_f72 * 0xd2 + 0x80;
    uVar28 = sVar59 + sStack_f70 * 0xc4 + 0x80;
    uVar32 = sVar63 + sStack_f6e * 0xb6 + 0x80;
    uVar36 = sVar67 + sStack_f6c * 0xa9 + 0x80;
    uVar40 = sVar71 + sStack_f6a * 0x9d + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar44 + local_f78 * 0x91 + 0x80;
    uVar18 = sVar48 + sStack_f76 * 0x85 + 0x80;
    uVar22 = sVar52 + sStack_f74 * 0x7a + 0x80;
    uVar26 = sVar56 + sStack_f72 * 0x6f + 0x80;
    uVar30 = sVar60 + sStack_f70 * 0x65 + 0x80;
    uVar34 = sVar64 + sStack_f6e * 0x5c + 0x80;
    uVar38 = sVar68 + sStack_f6c * 0x53 + 0x80;
    uVar42 = sVar72 + sStack_f6a * 0x4a + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    *local_1728 = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                           CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                    (0xff < uVar37),
                                    CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8)
                                             - (0xff < uVar33),
                                             CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                      (char)(uVar28 >> 8) - (0xff < uVar29),
                                                      CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                               (char)(uVar24 >> 8) - (0xff < uVar25)
                                                               ,CONCAT12((uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21),
                                                                         CONCAT11((uVar17 != 0) *
                                                                                  (uVar17 < 0x100) *
                                                                                  (char)(uVar16 >> 8
                                                                                        ) - (0xff < 
                                                  uVar17),(uVar12 != 0) * (uVar12 < 0x100) *
                                                          (char)(uVar11 >> 8) - (0xff < uVar12))))))
                                   ));
    local_1728[1] =
         CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43),
                  CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                           CONCAT15((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                    (0xff < uVar35),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar14 != 0) *
                                                                         (uVar14 < 0x100) *
                                                                         (char)(uVar13 >> 8) -
                                                                         (0xff < uVar14))))))));
    uVar11 = sVar45 + local_f78 * 0x42 + 0x80;
    uVar16 = sVar49 + sStack_f76 * 0x3b + 0x80;
    uVar20 = sVar53 + sStack_f74 * 0x34 + 0x80;
    uVar24 = sVar57 + sStack_f72 * 0x2d + 0x80;
    uVar28 = sVar61 + sStack_f70 * 0x27 + 0x80;
    uVar32 = sVar65 + sStack_f6e * 0x22 + 0x80;
    uVar36 = sVar69 + sStack_f6c * 0x1d + 0x80;
    uVar40 = sVar73 + sStack_f6a * 0x19 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    uVar13 = sVar46 + local_f78 * 0x15 + 0x80;
    uVar18 = sVar50 + sStack_f76 * 0x11 + 0x80;
    uVar22 = sVar54 + sStack_f74 * 0xe + 0x80;
    uVar26 = sVar58 + sStack_f72 * 0xc + 0x80;
    uVar30 = sVar62 + sStack_f70 * 10 + 0x80;
    uVar34 = sVar66 + sStack_f6e * 9 + 0x80;
    uVar38 = sVar70 + sStack_f6c * 8 + 0x80;
    uVar42 = sVar74 + sStack_f6a * 8 + 0x80;
    uVar14 = uVar13 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar43 = uVar42 >> 8;
    local_1728[2] =
         CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41),
                  CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                           CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                    (0xff < uVar33),
                                    CONCAT14((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8)
                                             - (0xff < uVar29),
                                             CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                      (char)(uVar24 >> 8) - (0xff < uVar25),
                                                      CONCAT12((uVar21 != 0) * (uVar21 < 0x100) *
                                                               (char)(uVar20 >> 8) - (0xff < uVar21)
                                                               ,CONCAT11((uVar17 != 0) *
                                                                         (uVar17 < 0x100) *
                                                                         (char)(uVar16 >> 8) -
                                                                         (0xff < uVar17),
                                                                         (uVar12 != 0) *
                                                                         (uVar12 < 0x100) *
                                                                         (char)(uVar11 >> 8) -
                                                                         (0xff < uVar12))))))));
    local_1728[3] =
         CONCAT17((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43),
                  CONCAT16((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                           CONCAT15((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                    (0xff < uVar35),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8)
                                             - (0xff < uVar31),
                                             CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                      (char)(uVar26 >> 8) - (0xff < uVar27),
                                                      CONCAT12((uVar23 != 0) * (uVar23 < 0x100) *
                                                               (char)(uVar22 >> 8) - (0xff < uVar23)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar14 != 0) *
                                                                         (uVar14 < 0x100) *
                                                                         (char)(uVar13 >> 8) -
                                                                         (0xff < uVar14))))))));
    local_1728 = (undefined8 *)(in_RSI + (long)local_1728);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_32x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_hi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
}